

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O2

void __thiscall FIR::stopband(FIR *this,int M,double f1,double f2)

{
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  setTaps(this,M);
  std::vector<float,_std::allocator<float>_>::resize(&this->freq,2);
  if ((((f2 <= 0.5) && (0.0 <= f1)) && (f1 <= 0.5)) && (0.0 <= f2)) {
    iVar3 = 0;
    setFreq(this,f1,0);
    setFreq(this,f2,1);
    this->type = 's';
    iVar1 = this->taps / 2;
    iVar2 = iVar1;
    if (iVar1 < 1) {
      iVar2 = -iVar1;
    }
    for (; iVar2 + iVar1 != iVar3; iVar3 = iVar3 + 1) {
      dVar4 = (f2 * -6.283185307179586 + f1 * 6.283185307179586) / 3.141592653589793 + 1.0;
      i = iVar1;
      if (iVar1 != iVar3) {
        dVar6 = (double)(-iVar1 + iVar3);
        dVar4 = sin(f1 * 6.283185307179586 * dVar6);
        dVar5 = sin(f2 * 6.283185307179586 * dVar6);
        dVar4 = (dVar4 - dVar5) / (dVar6 * 3.141592653589793);
        i = iVar3;
      }
      setCoeff(this,dVar4,i);
    }
    return;
  }
  puts("\nThe frequencies are not normalized");
  return;
}

Assistant:

void FIR::stopband(int M, double f1, double f2){

	this->setTaps(M);

	freq.resize(2);

	if (f1<0.0 or f1>0.5 or f2<0.0 or f2>0.5){printf("\nThe frequencies are not normalized\n");}
	else{
		this->setFreq(f1,0);
		this->setFreq(f2,1);
		this->setType('s');
		int M=this->getTaps();
		
		for (int i=-int(M/2); i<int(M/2); i++){
			if (i==0) {
				this->setCoeff(1+((2*M_PI*f1)-(2*M_PI*f2))/M_PI,i+int(M/2));
			}else{		
				this->setCoeff(((sin(2*M_PI*f1*i)-sin(2*M_PI*f2*i))/(i*M_PI)),i+int(M/2));
			}
		}
	}
}